

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall cppcms::json::value::copyable::copyable(copyable *this,copyable *r)

{
  _data *v;
  copy_ptr<cppcms::json::value::_data> *in_RSI;
  copy_ptr<cppcms::json::value::_data> *in_RDI;
  
  v = (_data *)operator_new(0x38);
  *(undefined8 *)((long)&(v->value_).m + 0x20) = 0;
  *(undefined8 *)((long)&(v->value_).m + 0x28) = 0;
  *(undefined8 *)((long)&(v->value_).m + 0x10) = 0;
  *(undefined8 *)((long)&(v->value_).m + 0x18) = 0;
  (v->value_).m.p = (void *)0x0;
  *(undefined8 *)((long)&(v->value_).m + 8) = 0;
  *(undefined8 *)&(v->value_).type = 0;
  value::_data::_data((_data *)0x3e241c);
  booster::copy_ptr<cppcms::json::value::_data>::copy_ptr(in_RDI,v);
  booster::copy_ptr<cppcms::json::value::_data>::swap(in_RDI,in_RSI);
  return;
}

Assistant:

value::copyable::copyable(value::copyable &&r) : d(new value::_data())
	{
		d.swap(r.d);
	}